

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O3

Variable * deqp::gls::findShaderOutputByName(Shader *shader,char *name)

{
  deBool dVar1;
  Variable *pVVar2;
  pointer ppVVar3;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> outputs;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> local_38;
  
  local_38.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rsg::Shader::getOutputs(shader,&local_38);
  if (local_38.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_38.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar2 = (Variable *)0x0;
  }
  else {
    pVVar2 = (Variable *)0x0;
    ppVVar3 = local_38.
              super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      dVar1 = deStringEqual(((*ppVVar3)->m_name)._M_dataplus._M_p,name);
      if (dVar1 != 0) {
        pVVar2 = *ppVVar3;
        break;
      }
      ppVVar3 = ppVVar3 + 1;
    } while (ppVVar3 !=
             local_38.
             super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_38.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar2;
}

Assistant:

static const rsg::Variable* findShaderOutputByName (const rsg::Shader& shader, const char* name)
{
	vector<const rsg::Variable*> outputs;
	shader.getOutputs(outputs);

	for (vector<const rsg::Variable*>::const_iterator iter = outputs.begin(); iter != outputs.end(); ++iter)
	{
		if (deStringEqual((*iter)->getName(), name))
			return *iter;
	}

	return DE_NULL;
}